

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::isolatePriorModifier(string *unit_string,string *modifier,char check1,char check2)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char cVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool local_38;
  
  local_38 = false;
  uVar4 = std::__cxx11::string::find((char *)unit_string,(ulong)(modifier->_M_dataplus)._M_p,0);
  if (uVar4 != 0xffffffffffffffff) {
    cVar9 = (char)unit_string;
    lVar5 = std::__cxx11::string::find_first_not_of(cVar9,0x20);
    if ((lVar5 == -1) ||
       (pcVar2 = (unit_string->_M_dataplus)._M_p, cVar1 = pcVar2[lVar5],
       cVar1 != check1 && cVar1 != check2)) {
      local_38 = false;
    }
    else {
      pcVar2[lVar5 + -1] = '_';
      local_38 = true;
    }
    uVar6 = std::__cxx11::string::find(cVar9,0x20);
    bVar10 = unit_string->_M_string_length <= uVar6;
    if (!bVar10) {
      pcVar2 = (unit_string->_M_dataplus)._M_p;
      cVar1 = pcVar2[uVar6 + 1];
      bVar10 = true;
      if ((cVar1 != '*') && (cVar1 != '/')) {
        cVar1 = pcVar2[uVar6 - 1];
        bVar10 = cVar1 == '/' || cVar1 == '*';
      }
    }
    if (!bVar10) {
      pcVar2 = (unit_string->_M_dataplus)._M_p;
      bVar10 = true;
      if (pcVar2[uVar6 + 1] != '(') {
        bVar10 = pcVar2[uVar6 - 1] == '(';
      }
      bVar12 = true;
      bVar11 = true;
      if (pcVar2[uVar6 + 1] != '-' && !bVar10) {
        bVar11 = pcVar2[uVar6 - 1] == '-';
      }
      if (!(bool)(bVar10 | bVar11)) {
        iVar3 = std::__cxx11::string::compare((ulong)unit_string,uVar6 + 1,(char *)0x2);
        bVar12 = iVar3 == 0;
      }
      bVar12 = (bool)(bVar12 | bVar10 | bVar11);
      bVar10 = true;
      if (!bVar12) {
        bVar10 = (unit_string->_M_dataplus)._M_p[uVar6 + 1] == 'U';
      }
      bVar10 = (bool)(bVar10 | bVar12);
    }
    if (!bVar10) {
      uVar7 = std::__cxx11::string::rfind(cVar9,0x2f);
      uVar8 = std::__cxx11::string::find(cVar9,0x2f);
      if (uVar7 < uVar4) {
        std::__cxx11::string::insert((ulong)unit_string,uVar7 + 1,'\x01');
        uVar6 = uVar6 + 1;
        if (uVar8 == 0xffffffffffffffff) {
          std::__cxx11::string::push_back(cVar9);
        }
        else {
          std::__cxx11::string::insert((ulong)unit_string,uVar8 + 1,'\x01');
        }
        bVar10 = uVar8 < uVar6;
        local_38 = true;
      }
      else {
        bVar10 = uVar8 < uVar6;
      }
    }
    if (!bVar10) {
      (unit_string->_M_dataplus)._M_p[uVar6] = '*';
      local_38 = true;
    }
  }
  return local_38;
}

Assistant:

static bool isolatePriorModifier(
    std::string& unit_string,
    const std::string& modifier,
    char check1,
    char check2)
{
    bool modified{false};
    auto modfind = unit_string.find(modifier);
    if (modfind != std::string::npos) {
        auto offset = modfind + modifier.size();
        // LCOV_EXCL_START
        // this condition is not used in current use cases but it is dangerous
        // to make assumptions that will always be the case
        if (modifier.back() != ' ') {
            ++offset;
        }
        // LCOV_EXCL_STOP
        auto kloc = unit_string.find_first_not_of(' ', offset);
        if (kloc != std::string::npos &&
            (unit_string[kloc] == check1 || unit_string[kloc] == check2)) {
            // this handles a misinterpretation of square+d to squared when in
            // middle of a unit
            unit_string[kloc - 1] = '_';
            modified = true;
        }
        auto nspace = unit_string.find_first_of(' ', kloc);
        auto skip = (nspace >= unit_string.size());
        if (!skip) {
            skip = isOperator(unit_string[nspace + 1]) ||
                isOperator(unit_string[nspace - 1]);
        }
        if (!skip) {
            skip = unit_string[nspace + 1] == '(' ||
                unit_string[nspace - 1] == '(';
            skip |=
                (skip || unit_string[nspace + 1] == '-' ||
                 unit_string[nspace - 1] == '-');
            skip |= skip || (unit_string.compare(nspace + 1, 2, "of") == 0);
            skip |= skip ||
                unit_string[nspace + 1] ==
                    'U';  // handle distance units with UK or US modifier
        }
        if (!skip) {
            auto divloc = unit_string.find_last_of('/', modfind);
            auto divloc2 = unit_string.find_first_of('/', modfind + 1);
            if (divloc < modfind) {
                unit_string.insert(divloc + 1, 1, '(');
                ++nspace;
                if (divloc2 != std::string::npos) {
                    unit_string.insert(divloc2 + 1, 1, ')');
                    // don't worry about nspace increment here as it will be
                    // skipped or the insertion after the space
                } else {
                    unit_string.push_back(')');
                }

                skip |= (divloc2 < nspace);
                modified = true;
            } else if (divloc2 < nspace) {
                skip = true;
            }
        }
        if (!skip) {
            unit_string[nspace] = '*';
            modified = true;
        }
    }
    return modified;
}